

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# final_contours_extract_features.cpp
# Opt level: O0

int main(int param_1,char **argv)

{
  char *__s;
  int in_R8D;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  char *local_120;
  char *source_window;
  _OutputArray local_110;
  _InputArray local_f8;
  _InputArray local_e0;
  _InputArray local_c8;
  allocator<char> local_99;
  string local_98 [32];
  Mat local_78;
  char **local_18;
  char **argv_local;
  int param_0_local;
  
  argv_local._4_4_ = 0;
  __s = argv[1];
  local_18 = argv;
  argv_local._0_4_ = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,__s,&local_99);
  cv::imread((string *)&local_78,(int)local_98);
  cv::Mat::operator=(&src,&local_78);
  cv::Mat::~Mat(&local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  cv::_InputArray::_InputArray(&local_c8,&src);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_e0,&src_gray);
  cv::cvtColor((cv *)&local_c8,&local_e0,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_e0);
  cv::_InputArray::~_InputArray(&local_c8);
  cv::_InputArray::_InputArray(&local_f8,&src_gray);
  cv::_OutputArray::_OutputArray(&local_110,&src_gray);
  cv::Size_<int>::Size_((Size_<int> *)&source_window,5,5);
  cv::GaussianBlur(0,&local_f8,&local_110,&source_window,4);
  cv::_OutputArray::~_OutputArray(&local_110);
  cv::_InputArray::~_InputArray(&local_f8);
  local_120 = "Source";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"Source",&local_141);
  cv::namedWindow(local_140,1);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168," Threshold:",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"Source",&local_191);
  cv::createTrackbar(local_168,local_190,&thresh,max_thresh,thresh_callback,(void *)0x0);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  thresh_callback(0,(void *)0x0);
  cv::waitKey(0);
  return 0;
}

Assistant:

int main( int, char** argv )
{
  /// Load source image and convert it to gray
  src = imread( argv[1], 1 );
  
//  pyrMeanShiftFiltering( src, dst, 10, 35, 3);
//  imshow("mean-segment", dst);
  /// Convert image to gray and blur it
  cvtColor( src, src_gray, COLOR_BGR2GRAY );
  GaussianBlur( src_gray, src_gray, Size(5,5),0,0 );
   //imshow("src_gray_blur", src_gray);
//	equalizeHist(src_gray, src_gray);
//	imshow("src_gray_eq", src_gray);
  /// Create Window
  const char* source_window = "Source";
  namedWindow( source_window, WINDOW_AUTOSIZE );
  //imshow( source_window, src );
//add for user threshold i/p
 createTrackbar( " Threshold:", "Source", &thresh, max_thresh, thresh_callback );
  thresh_callback( 0, 0 );

  waitKey(0);
  return(0);
}